

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O0

void place_wsegs(monst *worm)

{
  wseg *local_18;
  wseg *curr;
  monst *worm_local;
  
  local_18 = worm->dlevel->wtails[worm->wormno];
  if (worm->wormno == '\0') {
    warning("place_wsegs: worm->wormno was 0");
  }
  else {
    for (; local_18 != worm->dlevel->wheads[worm->wormno]; local_18 = local_18->nseg) {
      worm->dlevel->monsters[local_18->wx][local_18->wy] = worm;
    }
  }
  return;
}

Assistant:

void place_wsegs(struct monst *worm)
{
    struct wseg *curr = worm->dlevel->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("place_wsegs: worm->wormno was 0");
	return;
    }

    while (curr != worm->dlevel->wheads[worm->wormno]) {
	place_worm_seg(worm, curr->wx, curr->wy);
	curr = curr->nseg;
    }
}